

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O0

void Abc_FlowRetime_Dfs_back(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *p;
  undefined4 local_24;
  int i;
  Abc_Obj_t *pNext;
  Vec_Ptr_t *vNodes_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsLatch(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
      p = Abc_ObjFanin(pObj,local_24);
      iVar1 = Abc_NodeIsTravIdCurrent(p);
      if (iVar1 == 0) {
        Abc_FlowRetime_Dfs_back(p,vNodes);
      }
    }
    Vec_PtrPush(vNodes,pObj);
  }
  return;
}

Assistant:

void Abc_FlowRetime_Dfs_back( Abc_Obj_t * pObj, Vec_Ptr_t *vNodes ) {
  Abc_Obj_t *pNext;
  int i;

  if (Abc_ObjIsLatch(pObj)) return;

  Abc_NodeSetTravIdCurrent( pObj );
  
  Abc_ObjForEachFanin( pObj, pNext, i )
    if (!Abc_NodeIsTravIdCurrent( pNext ))
      Abc_FlowRetime_Dfs_back( pNext, vNodes );

  Vec_PtrPush( vNodes, pObj );
}